

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O0

void __thiscall chatter::Protocol::calculate_rtt(Protocol *this,Peer *peer,uint64_t measurement)

{
  undefined2 uVar1;
  uint64_t uVar2;
  long lVar3;
  float extraout_XMM0_Da;
  float fVar4;
  float local_34;
  float error;
  uint64_t measurement_local;
  Peer *peer_local;
  Protocol *this_local;
  
  if (peer != (Peer *)0x0) {
    local_34 = (float)(measurement - peer->m_rtt_avg);
    lVar3 = (long)(local_34 * 0.125);
    uVar1 = peer->m_rtt_avg;
    peer->m_rtt_avg =
         uVar1 + ((ushort)lVar3 |
                 (ushort)(long)(local_34 * 0.125 - 9.223372e+18) & (ushort)(lVar3 >> 0x3f));
    std::abs((int)this);
    fVar4 = (extraout_XMM0_Da - (float)peer->m_rtt_dev) * 0.25;
    lVar3 = (long)fVar4;
    peer->m_rtt_dev =
         peer->m_rtt_dev +
         ((ushort)lVar3 | (ushort)(long)(fVar4 - 9.223372e+18) & (ushort)(lVar3 >> 0x3f));
    uVar2 = Host::timestamp_now(this->m_host);
    peer->m_last_rtt_ts = uVar2;
  }
  return;
}

Assistant:

void Protocol::calculate_rtt(Peer* peer, uint64_t measurement)
{
    static const float avg_gain = 0.125;
    static const float dev_gain = 0.25;

    if (!peer)
        return;

    float error = measurement - peer->m_rtt_avg;

    peer->m_rtt_avg += static_cast<uint64_t>(avg_gain * error);
    peer->m_rtt_dev += static_cast<uint64_t>(dev_gain * (std::abs(error) - peer->m_rtt_dev));
    peer->m_last_rtt_ts = m_host->timestamp_now();
}